

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int begin_get_offered_capabilities(BEGIN_HANDLE begin,AMQP_VALUE *offered_capabilities_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE single_amqp_value;
  char *pcStack_38;
  int get_single_value_result;
  char *offered_capabilities_single_value;
  AMQP_VALUE item_value;
  BEGIN_INSTANCE *begin_instance;
  uint32_t item_count;
  int result;
  AMQP_VALUE *offered_capabilities_value_local;
  BEGIN_HANDLE begin_local;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    begin_instance._4_4_ = 0xbfc;
  }
  else {
    item_value = (AMQP_VALUE)begin;
    _item_count = offered_capabilities_value;
    offered_capabilities_value_local = &begin->composite_value;
    iVar1 = amqpvalue_get_composite_item_count(begin->composite_value,(uint32_t *)&begin_instance);
    if (iVar1 == 0) {
      if ((uint)begin_instance < 6) {
        begin_instance._4_4_ = 0xc0a;
      }
      else {
        offered_capabilities_single_value =
             (char *)amqpvalue_get_composite_item_in_place(*(AMQP_VALUE *)item_value,5);
        if (((AMQP_VALUE)offered_capabilities_single_value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type((AMQP_VALUE)offered_capabilities_single_value),
           AVar2 == AMQP_TYPE_NULL)) {
          begin_instance._4_4_ = 0xc12;
        }
        else {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)offered_capabilities_single_value);
          if (AVar2 == AMQP_TYPE_ARRAY) {
            memset(&stack0xffffffffffffffc8,0,8);
            single_amqp_value._4_4_ = 1;
          }
          else {
            single_amqp_value._4_4_ =
                 amqpvalue_get_symbol
                           ((AMQP_VALUE)offered_capabilities_single_value,&stack0xffffffffffffffc8);
          }
          AVar2 = amqpvalue_get_type((AMQP_VALUE)offered_capabilities_single_value);
          if (((AVar2 == AMQP_TYPE_ARRAY) &&
              (iVar1 = amqpvalue_get_array((AMQP_VALUE)offered_capabilities_single_value,_item_count
                                          ), iVar1 == 0)) || (single_amqp_value._4_4_ == 0)) {
            AVar2 = amqpvalue_get_type((AMQP_VALUE)offered_capabilities_single_value);
            if (AVar2 == AMQP_TYPE_ARRAY) {
              begin_instance._4_4_ = 0;
            }
            else {
              pAVar3 = amqpvalue_create_array();
              *_item_count = pAVar3;
              if (*_item_count == (AMQP_VALUE)0x0) {
                begin_instance._4_4_ = 0xc2e;
              }
              else {
                pAVar3 = amqpvalue_create_symbol(pcStack_38);
                if (pAVar3 == (AMQP_VALUE)0x0) {
                  begin_instance._4_4_ = 0xc35;
                }
                else {
                  iVar1 = amqpvalue_add_array_item(*_item_count,pAVar3);
                  if (iVar1 == 0) {
                    iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)item_value,5,*_item_count);
                    if (iVar1 == 0) {
                      begin_instance._4_4_ = 0;
                    }
                    else {
                      begin_instance._4_4_ = 0xc41;
                    }
                  }
                  else {
                    begin_instance._4_4_ = 0xc3b;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                amqpvalue_destroy(*_item_count);
              }
            }
          }
          else {
            begin_instance._4_4_ = 0xc25;
          }
        }
      }
    }
    else {
      begin_instance._4_4_ = 0xc04;
    }
  }
  return begin_instance._4_4_;
}

Assistant:

int begin_get_offered_capabilities(BEGIN_HANDLE begin, AMQP_VALUE* offered_capabilities_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        if (amqpvalue_get_composite_item_count(begin_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 5)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(begin_instance->composite_value, 5);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* offered_capabilities_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &offered_capabilities_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&offered_capabilities_single_value, 0, sizeof(offered_capabilities_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, offered_capabilities_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *offered_capabilities_value = amqpvalue_create_array();
                            if (*offered_capabilities_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(offered_capabilities_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*offered_capabilities_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(begin_instance->composite_value, 5, *offered_capabilities_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*offered_capabilities_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}